

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

double * __thiscall dynamicgraph::SignalPtr<double,_int>::accessCopy(SignalPtr<double,_int> *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  Signal<double,_int> *pSVar5;
  undefined4 extraout_var;
  SignalPtr<double,_int> *this_local;
  
  if ((((this->modeNoThrow & 1U) != 0) && (uVar2 = (*this->_vptr_SignalPtr[4])(), (uVar2 & 1) == 0))
     && (((&this->field_0x50)[(long)this->_vptr_SignalPtr[-3]] & 1) != 0)) {
    pdVar4 = Signal<double,_int>::accessCopy
                       ((Signal<double,_int> *)
                        ((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
    return pdVar4;
  }
  bVar1 = autoref(this);
  if (bVar1) {
    this_local = (SignalPtr<double,_int> *)
                 Signal<double,_int>::accessCopy
                           ((Signal<double,_int> *)
                            ((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
  }
  else if ((this->transmitAbstract & 1U) == 0) {
    pSVar5 = getPtr(this);
    iVar3 = (*(pSVar5->super_SignalBase<int>)._vptr_SignalBase[0x1d])();
    this_local = (SignalPtr<double,_int> *)CONCAT44(extraout_var,iVar3);
  }
  else {
    this_local = (SignalPtr<double,_int> *)this->transmitAbstractData;
  }
  return (double *)this_local;
}

Assistant:

const T &SignalPtr<T, Time>::accessCopy() const {
  if (modeNoThrow && (!isPlugged()) && Signal<T, Time>::copyInit)
    return Signal<T, Time>::accessCopy();
  else if (autoref())
    return Signal<T, Time>::accessCopy();
  else if (transmitAbstract)
    return *transmitAbstractData;
  else
    return getPtr()->accessCopy();
}